

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMateGeneric::IntLoadConstraint_C
          (ChLinkMateGeneric *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChConstraintTwoBodies *pCVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  char cVar8;
  int iVar9;
  ulong uVar10;
  char *__function;
  int iVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_register_00001208 [56];
  undefined8 in_XMM1_Qb;
  undefined1 auVar20 [64];
  ulong local_48;
  
  auVar20._8_56_ = in_register_00001208;
  auVar20._0_8_ = c;
  iVar9 = (this->mask).nconstr;
  if (0 < iVar9) {
    auVar20 = ZEXT1664(auVar20._0_16_);
    auVar7._8_8_ = in_XMM1_Qb;
    auVar7._0_8_ = recovery_clamp;
    lVar14 = 0;
    iVar11 = 0;
    auVar15._8_8_ = 0x8000000000000000;
    auVar15._0_8_ = 0x8000000000000000;
    auVar15 = vxorpd_avx512vl(auVar7,auVar15);
    do {
      lVar13 = (long)iVar9;
      if (lVar13 <= lVar14) {
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      pCVar5 = (this->mask).constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar14];
      if ((pCVar5->super_ChConstraintTwo).super_ChConstraint.active == true) {
        lVar13 = (long)iVar11;
        if (do_clamp) {
          cVar8 = (**(code **)((long)(pCVar5->super_ChConstraintTwo).super_ChConstraint.
                                     _vptr_ChConstraint + 0x18))();
          bVar6 = (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
                  m_rows <= lVar13;
          local_48 = auVar15._0_8_;
          if (cVar8 == '\0') {
            if (bVar6 || iVar11 < 0) goto LAB_005a5b02;
            uVar10 = (ulong)(iVar11 + off_L);
            if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows <= (long)uVar10) goto LAB_005a5aeb;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_48;
            auVar19._8_8_ = 0;
            auVar19._0_8_ =
                 c * (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[lVar13];
            auVar7 = vmaxsd_avx(auVar19,auVar3);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = recovery_clamp;
            auVar7 = vminsd_avx(auVar7,auVar4);
            dVar16 = auVar7._0_8_;
          }
          else {
            if (bVar6 || iVar11 < 0) {
LAB_005a5b02:
              __function = 
              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 6, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 6, 1>, Level = 1]"
              ;
LAB_005a5b17:
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,__function)
              ;
            }
            uVar10 = (ulong)(iVar11 + off_L);
            if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows <= (long)uVar10) {
LAB_005a5aeb:
              __function = 
              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
              ;
              goto LAB_005a5b17;
            }
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_48;
            auVar17._8_8_ = 0;
            auVar17._0_8_ =
                 c * (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[lVar13];
            auVar7 = vmaxsd_avx(auVar17,auVar1);
            dVar16 = auVar7._0_8_;
          }
          auVar20 = ZEXT864((ulong)c);
          pdVar12 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          dVar16 = dVar16 + pdVar12[uVar10];
        }
        else {
          if ((iVar11 < 0) ||
             ((this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
              m_rows <= lVar13)) goto LAB_005a5b02;
          uVar10 = (ulong)(iVar11 + off_L);
          if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= (long)uVar10) goto LAB_005a5aeb;
          pdVar12 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          auVar18._8_8_ = 0;
          auVar18._0_8_ =
               (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
               m_data.array[lVar13];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pdVar12[uVar10];
          auVar7 = vfmadd213sd_fma(auVar18,auVar20._0_16_,auVar2);
          dVar16 = auVar7._0_8_;
        }
        pdVar12[uVar10] = dVar16;
        iVar11 = iVar11 + 1;
        iVar9 = (this->mask).nconstr;
        lVar13 = (long)iVar9;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < lVar13);
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntLoadConstraint_C(const unsigned int off_L,
                                            ChVectorDynamic<>& Qc,
                                            const double c,
                                            bool do_clamp,
                                            double recovery_clamp) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            if (do_clamp) {
                if (mask.Constr_N(i).IsUnilateral())
                    Qc(off_L + cnt) += ChMax(c * C(cnt), -recovery_clamp);
                else
                    Qc(off_L + cnt) += ChMin(ChMax(c * C(cnt), -recovery_clamp), recovery_clamp);
            } else
                Qc(off_L + cnt) += c * C(cnt);
            cnt++;
        }
    }
}